

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_23::BinaryReader::ReadExportSection(BinaryReader *this,Offset section_size)

{
  bool bVar1;
  Result RVar2;
  uint local_58;
  Enum local_54;
  Index item_index;
  Enum local_4c;
  ExternalKind kind;
  string_view name;
  Index i;
  uint local_28;
  Enum local_24;
  Index num_exports;
  Offset section_size_local;
  BinaryReader *this_local;
  
  _num_exports = section_size;
  section_size_local = (Offset)this;
  local_24 = (*this->delegate_->_vptr_BinaryReaderDelegate[0x2b])(this->delegate_,section_size);
  bVar1 = Succeeded((Result)local_24);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    RVar2 = ReadCount(this,&local_28,"export count");
    bVar1 = Failed(RVar2);
    if (bVar1) {
      Result::Result((Result *)((long)&this_local + 4),Error);
    }
    else {
      RVar2.enum_ = (*this->delegate_->_vptr_BinaryReaderDelegate[0x2c])();
      bVar1 = Succeeded(RVar2);
      if (((bVar1 ^ 0xffU) & 1) == 0) {
        for (name.size_._4_4_ = 0; name.size_._4_4_ < local_28;
            name.size_._4_4_ = name.size_._4_4_ + 1) {
          string_view::string_view((string_view *)&kind);
          local_4c = (Enum)ReadStr(this,(string_view *)&kind,"export item name");
          bVar1 = Failed((Result)local_4c);
          if (bVar1) {
            Result::Result((Result *)((long)&this_local + 4),Error);
            return (Result)this_local._4_4_;
          }
          local_54 = (Enum)ReadExternalKind(this,&item_index,"export kind");
          bVar1 = Failed((Result)local_54);
          if (bVar1) {
            Result::Result((Result *)((long)&this_local + 4),Error);
            return (Result)this_local._4_4_;
          }
          RVar2 = ReadIndex(this,&local_58,"export item index");
          bVar1 = Failed(RVar2);
          if (bVar1) {
            Result::Result((Result *)((long)&this_local + 4),Error);
            return (Result)this_local._4_4_;
          }
          if ((item_index == 4) &&
             (bVar1 = Features::exceptions_enabled(&this->options_->features), !bVar1)) {
            PrintError(this,"invalid export event kind: exceptions not allowed");
            Result::Result((Result *)((long)&this_local + 4),Error);
            return (Result)this_local._4_4_;
          }
          RVar2.enum_ = (*this->delegate_->_vptr_BinaryReaderDelegate[0x2d])
                                  (this->delegate_,(ulong)name.size_._4_4_,(ulong)item_index,
                                   (ulong)local_58,_kind,name.data_);
          bVar1 = Succeeded(RVar2);
          if (((bVar1 ^ 0xffU) & 1) != 0) {
            PrintError(this,"OnExport callback failed");
            Result::Result((Result *)((long)&this_local + 4),Error);
            return (Result)this_local._4_4_;
          }
        }
        RVar2.enum_ = (*this->delegate_->_vptr_BinaryReaderDelegate[0x2e])();
        bVar1 = Succeeded(RVar2);
        if (((bVar1 ^ 0xffU) & 1) == 0) {
          Result::Result((Result *)((long)&this_local + 4),Ok);
        }
        else {
          PrintError(this,"EndExportSection callback failed");
          Result::Result((Result *)((long)&this_local + 4),Error);
        }
      }
      else {
        PrintError(this,"OnExportCount callback failed");
        Result::Result((Result *)((long)&this_local + 4),Error);
      }
    }
  }
  else {
    PrintError(this,"BeginExportSection callback failed");
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result BinaryReader::ReadExportSection(Offset section_size) {
  CALLBACK(BeginExportSection, section_size);
  Index num_exports;
  CHECK_RESULT(ReadCount(&num_exports, "export count"));
  CALLBACK(OnExportCount, num_exports);
  for (Index i = 0; i < num_exports; ++i) {
    string_view name;
    CHECK_RESULT(ReadStr(&name, "export item name"));

    ExternalKind kind;
    CHECK_RESULT(ReadExternalKind(&kind, "export kind"));

    Index item_index;
    CHECK_RESULT(ReadIndex(&item_index, "export item index"));
    if (kind == ExternalKind::Event) {
      ERROR_UNLESS(options_.features.exceptions_enabled(),
                   "invalid export event kind: exceptions not allowed");
    }

    CALLBACK(OnExport, i, static_cast<ExternalKind>(kind), item_index, name);
  }
  CALLBACK0(EndExportSection);
  return Result::Ok;
}